

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall
CPP::WriteInitialization::initializeMenu(WriteInitialization *this,DomWidget *w,QString *param_2)

{
  DomAction *pDVar1;
  QTextStream *pQVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QLatin1String> local_80;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Driver::findOrInsertWidget(&local_48,this->m_driver,w);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_80.b.m_size = 6;
  local_80.b.m_data = "Action";
  local_80.a = &local_48;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>(&local_68,&local_80);
  pDVar1 = Driver::actionByName(this->m_driver,&local_68);
  if ((pDVar1 != (DomAction *)0x0) && (pDVar1->m_has_attr_menu == true)) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_68);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2," = ");
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_48);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&language::derefPointer);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"menuAction()");
    QTextStream::operator<<(pQVar2,(QString *)&language::eol);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::initializeMenu(DomWidget *w, const QString &/*parentWidget*/)
{
    const QString menuName = m_driver->findOrInsertWidget(w);
    const QString menuAction = menuName + "Action"_L1;

    const DomAction *action = m_driver->actionByName(menuAction);
    if (action && action->hasAttributeMenu()) {
        m_output << m_indent << menuAction << " = " << menuName
            << language::derefPointer << "menuAction()" << language::eol;
    }
}